

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_setHighsDoubleOptionValue(void *highs,char *option,double value)

{
  HighsInt HVar1;
  allocator local_5a;
  allocator local_59;
  double local_58;
  string local_50;
  string local_30;
  
  local_58 = value;
  std::__cxx11::string::string((string *)&local_30,"Highs_setHighsDoubleOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_50,"Highs_setDoubleOptionValue",&local_5a);
  Highs::deprecationMessage((Highs *)highs,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  HVar1 = Highs_setDoubleOptionValue(highs,option,local_58);
  return HVar1;
}

Assistant:

HighsInt Highs_setHighsDoubleOptionValue(void* highs, const char* option,
                                         const double value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_setHighsDoubleOptionValue",
                           "Highs_setDoubleOptionValue");
  return Highs_setDoubleOptionValue(highs, option, value);
}